

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::removeCols(SPxLPBase<double> *this,SPxColId *id,int n,int *perm)

{
  int iVar1;
  int *piVar2;
  SPxLPBase<double> *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  int i;
  DataArray<int> p;
  SPxColId *in_stack_ffffffffffffff88;
  DataArray<int> *in_stack_ffffffffffffff90;
  SPxLPBase<double> *pSVar3;
  DataArray<int> *this_00;
  DataArray<int> *in_stack_ffffffffffffffa0;
  int local_48;
  DataArray<int> local_38;
  SPxLPBase<double> *local_20;
  int local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  if (in_RCX == (SPxLPBase<double> *)0x0) {
    local_10 = in_RSI;
    nCols((SPxLPBase<double> *)0x23aa07);
    this_00 = &local_38;
    DataArray<int>::DataArray
              (in_stack_ffffffffffffffa0,(int)((ulong)this_00 >> 0x20),(int)this_00,
               (Real)in_stack_ffffffffffffff90);
    piVar2 = DataArray<int>::get_ptr(this_00);
    (**(code **)(*in_RDI + 0xc0))(in_RDI,local_10,local_14,piVar2);
    DataArray<int>::~DataArray(in_stack_ffffffffffffff90);
  }
  else {
    local_20 = in_RCX;
    local_48 = nCols((SPxLPBase<double> *)0x23aa93);
    while (local_48 = local_48 + -1, -1 < local_48) {
      *(int *)((long)&(local_20->super_LPRowSetBase<double>).super_SVSetBase<double>.
                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray +
              (long)local_48 * 4) = local_48;
    }
    while (local_14 != 0) {
      pSVar3 = local_20;
      local_14 = local_14 + -1;
      iVar1 = number(local_20,in_stack_ffffffffffffff88);
      *(undefined4 *)
       ((long)&(pSVar3->super_LPRowSetBase<double>).super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + (long)iVar1 * 4) =
           0xffffffff;
    }
    local_14 = local_14 + -1;
    (**(code **)(*in_RDI + 0xb8))(in_RDI,local_20);
  }
  return;
}

Assistant:

virtual void removeCols(SPxColId id[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nCols());
         removeCols(id, n, p.get_ptr());
         return;
      }

      for(int i = nCols() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[number(id[n])] = -1;

      removeCols(perm);
   }